

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O2

void anon_unknown.dwarf_232db::gen2(Value **L,Value **R,int *Budget,int Width)

{
  bool bVar1;
  uint uVar2;
  Value *pVVar3;
  
  pVVar3 = genVal(Budget,Width,true,true);
  *L = pVVar3;
  bVar1 = llvm::isa_impl_wrap<llvm::Constant,_llvm::Value_*const,_const_llvm::Value_*>::doit(L);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = llvm::isa_impl_wrap<llvm::UndefValue,_llvm::Value_*const,_const_llvm::Value_*>::doit(L);
    bVar1 = !bVar1;
  }
  pVVar3 = genVal(Budget,Width,bVar1,true);
  *R = pVVar3;
  uVar2 = rand();
  if ((uVar2 & 1) == 0) {
    pVVar3 = *L;
    *L = *R;
    *R = pVVar3;
  }
  return;
}

Assistant:

void gen2(Value *&L, Value *&R, int &Budget, int Width) {
  L = genVal(Budget, Width, true);
  R = genVal(Budget, Width, !isa<Constant>(L) && !isa<UndefValue>(L));
  if ((rand() & 1) == 0) {
    Value *T = L;
    L = R;
    R = T;
  }
}